

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,uint8_t *left,int32_t leftLength,uint8_t *right,
          int32_t rightLength,UErrorCode *errorCode)

{
  byte *pbVar1;
  byte bVar2;
  Normalizer2Impl *nfcImpl;
  byte numeric;
  UBool UVar3;
  UCollationResult UVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  CollationSettings *pCVar13;
  int32_t leftLength_00;
  int iVar14;
  uint local_464;
  uint local_460;
  uint local_45c;
  UErrorCode *local_458;
  UTF8CollationIterator rightIter;
  UTF8CollationIterator leftIter;
  
  if (left == right && leftLength == rightLength) {
    return UCOL_EQUAL;
  }
  local_464 = 0;
  if (leftLength < 0) {
    uVar12 = 0;
    while (left[uVar12] == right[uVar12]) {
      if (left[uVar12] == '\0') {
        return UCOL_EQUAL;
      }
      uVar12 = uVar12 + 1;
      local_464 = (uint)uVar12;
    }
LAB_0021bbdc:
    uVar9 = uVar12 & 0xffffffff;
  }
  else {
    uVar9 = (ulong)(uint)leftLength;
    uVar12 = 0;
    while (uVar9 != uVar12) {
      if ((long)rightLength == uVar12) {
        uVar9 = (ulong)(uint)rightLength;
        goto LAB_0021bbef;
      }
      if (left[uVar12] != right[uVar12]) goto LAB_0021bbdc;
      uVar12 = uVar12 + 1;
      local_464 = (uint)uVar12;
    }
    if (leftLength == rightLength) {
      return UCOL_EQUAL;
    }
  }
LAB_0021bbef:
  uVar11 = (uint)uVar12;
  iVar14 = (int)uVar9;
  if ((0 < iVar14) &&
     (((iVar14 != leftLength && ((char)left[uVar9] < -0x40)) ||
      ((iVar14 != rightLength && ((char)right[uVar9] < -0x40)))))) {
    uVar12 = uVar12 & 0xffffffff;
    do {
      iVar14 = (int)uVar12;
      if (iVar14 < 2) break;
      uVar12 = uVar12 - 1;
    } while ((char)left[uVar12 & 0xffffffff] < -0x40);
    uVar11 = iVar14 - 1;
    local_464 = uVar11;
  }
  numeric = (byte)this->settings->options >> 1 & 1;
  local_460 = leftLength;
  local_45c = rightLength;
  local_458 = errorCode;
  if (0 < (int)uVar11) {
    uVar12 = (ulong)uVar11;
    if (uVar11 == leftLength) {
LAB_0021bc88:
      if (uVar11 != local_45c) {
        bVar2 = right[uVar12];
        uVar11 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar9 = uVar12 + 1;
          uVar11 = 0xfffd;
          if ((uint)uVar9 != local_45c) {
            if (bVar2 < 0xe0) {
              if (0xc1 < bVar2) {
                uVar5 = bVar2 & 0x1f;
LAB_0021c065:
                if ((byte)(right[uVar9 & 0xffffffff] ^ 0x80) < 0x40) {
                  uVar11 = uVar5 << 6 | right[uVar9 & 0xffffffff] ^ 0x80;
                }
              }
            }
            else if (bVar2 < 0xf0) {
              uVar5 = bVar2 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar5] >> (right[uVar9] >> 5) & 1) != 0) {
                bVar10 = right[uVar9] & 0x3f;
LAB_0021c016:
                uVar8 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar8;
                if (uVar8 != local_45c) {
                  uVar5 = (uint)bVar10 | uVar5 << 6;
                  goto LAB_0021c065;
                }
              }
            }
            else if (bVar2 < 0xf5) {
              pbVar1 = right + uVar9;
              if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                  (uVar9 = uVar12 + 2, (uint)uVar9 != local_45c)) &&
                 (bVar10 = right[uVar9] + 0x80, bVar10 < 0x40)) {
                uVar5 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                goto LAB_0021c016;
              }
            }
          }
        }
        UVar3 = CollationData::isUnsafeBackward(this->data,uVar11,numeric);
        if (UVar3 != '\0') goto LAB_0021bcbf;
      }
    }
    else {
      bVar2 = left[uVar12];
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        uVar9 = uVar12 + 1;
        uVar5 = 0xfffd;
        if ((int)uVar9 != leftLength) {
          if (bVar2 < 0xe0) {
            if (0xc1 < bVar2) {
              uVar8 = bVar2 & 0x1f;
LAB_0021c038:
              if ((byte)(left[uVar9 & 0xffffffff] ^ 0x80) < 0x40) {
                uVar5 = uVar8 << 6 | left[uVar9 & 0xffffffff] ^ 0x80;
              }
            }
          }
          else if (bVar2 < 0xf0) {
            uVar8 = bVar2 & 0xf;
            if (((byte)" 000000000000\x1000"[uVar8] >> (left[uVar9] >> 5) & 1) != 0) {
              bVar10 = left[uVar9] & 0x3f;
LAB_0021bfc8:
              uVar7 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar7;
              if (uVar7 != leftLength) {
                uVar8 = (uint)bVar10 | uVar8 << 6;
                goto LAB_0021c038;
              }
            }
          }
          else if (bVar2 < 0xf5) {
            pbVar1 = left + uVar9;
            if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                (uVar9 = uVar12 + 2, (int)uVar9 != leftLength)) &&
               (bVar10 = left[uVar9] + 0x80, bVar10 < 0x40)) {
              uVar8 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
              goto LAB_0021bfc8;
            }
          }
        }
      }
      UVar3 = CollationData::isUnsafeBackward(this->data,uVar5,numeric);
      if (UVar3 == '\0') goto LAB_0021bc88;
LAB_0021bcbf:
      do {
        lVar6 = (long)(int)local_464;
        local_464 = local_464 - 1;
        bVar2 = left[lVar6 + -1];
        uVar11 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar11 = utf8_prevCharSafeBody_63(left,0,(int32_t *)&local_464,(uint)bVar2,-3);
        }
      } while ((0 < (int)local_464) &&
              (UVar3 = CollationData::isUnsafeBackward(this->data,uVar11,numeric), UVar3 != '\0'));
    }
  }
  uVar11 = local_45c;
  pCVar13 = this->settings;
  if (((-1 < pCVar13->fastLatinOptions) &&
      ((lVar6 = (long)(int)local_464, local_460 == local_464 || (left[lVar6] < 0xc6)))) &&
     ((local_45c == local_464 || (right[lVar6] < 0xc6)))) {
    if ((int)local_460 < 0) {
      iVar14 = -1;
      leftLength_00 = -1;
    }
    else {
      leftLength_00 = local_460 - local_464;
      iVar14 = local_45c - local_464;
    }
    UVar4 = CollationFastLatin::compareUTF8
                      (this->data->fastLatinTable,pCVar13->fastLatinPrimaries,
                       pCVar13->fastLatinOptions,left + lVar6,leftLength_00,right + lVar6,iVar14);
    if (UVar4 != ~UCOL_GREATER) goto LAB_0021be7d;
    pCVar13 = this->settings;
  }
  if ((pCVar13->options & 1) == 0) {
    UTF8CollationIterator::UTF8CollationIterator
              (&leftIter,this->data,numeric,left,local_464,local_460);
    UTF8CollationIterator::UTF8CollationIterator
              (&rightIter,this->data,numeric,right,local_464,uVar11);
    UVar4 = CollationCompare::compareUpToQuaternary
                      (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                       this->settings,local_458);
    UTF8CollationIterator::~UTF8CollationIterator(&rightIter);
    UTF8CollationIterator::~UTF8CollationIterator(&leftIter);
  }
  else {
    FCDUTF8CollationIterator::FCDUTF8CollationIterator
              ((FCDUTF8CollationIterator *)&leftIter,this->data,numeric,left,local_464,local_460);
    FCDUTF8CollationIterator::FCDUTF8CollationIterator
              ((FCDUTF8CollationIterator *)&rightIter,this->data,numeric,right,local_464,uVar11);
    UVar4 = CollationCompare::compareUpToQuaternary
                      (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                       this->settings,local_458);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)&rightIter);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)&leftIter);
  }
LAB_0021be7d:
  if (UVar4 == UCOL_EQUAL) {
    uVar5 = this->settings->options;
    UVar4 = UCOL_EQUAL;
    if ((0xefff < (int)uVar5) && (*local_458 < U_ILLEGAL_ARGUMENT_ERROR)) {
      lVar6 = (long)(int)local_464;
      leftIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)(left + lVar6);
      uVar8 = 0;
      if (0 < (int)local_460) {
        uVar8 = local_464;
      }
      nfcImpl = this->data->nfcImpl;
      leftIter.super_CollationIterator.ceBuffer.buffer._12_4_ = local_460 - uVar8;
      if ((uVar5 & 1) == 0) {
        leftIter.super_CollationIterator.ceBuffer.length = -1;
        leftIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        leftIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_0039a9f8;
        leftIter.super_CollationIterator.ceBuffer.buffer.capacity = 0;
        rightIter.super_CollationIterator.ceBuffer.length = -1;
        rightIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        rightIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_0039a9f8;
        rightIter.super_CollationIterator.ceBuffer.buffer.capacity = 0;
        rightIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)(right + lVar6);
        rightIter.super_CollationIterator.ceBuffer.buffer._12_4_ = uVar11 - uVar8;
        UVar4 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        UObject::~UObject((UObject *)&rightIter);
        UObject::~UObject((UObject *)&leftIter);
      }
      else {
        anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                  ((FCDUTF8NFDIterator *)&leftIter,this->data,
                   (uint8_t *)leftIter.super_CollationIterator.ceBuffer.buffer.ptr,
                   leftIter.super_CollationIterator.ceBuffer.buffer._12_4_);
        anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                  ((FCDUTF8NFDIterator *)&rightIter,this->data,right + lVar6,uVar11 - uVar8);
        UVar4 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator((FCDUTF8NFDIterator *)&rightIter);
        anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator((FCDUTF8NFDIterator *)&leftIter);
      }
    }
  }
  return UVar4;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const uint8_t *left, int32_t leftLength,
                             const uint8_t *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        uint8_t c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }
    // Back up to the start of a partially-equal code point.
    if(equalPrefixLength > 0 &&
            ((equalPrefixLength != leftLength && U8_IS_TRAIL(left[equalPrefixLength])) ||
            (equalPrefixLength != rightLength && U8_IS_TRAIL(right[equalPrefixLength])))) {
        while(--equalPrefixLength > 0 && U8_IS_TRAIL(left[equalPrefixLength])) {}
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        UBool unsafe = FALSE;
        if(equalPrefixLength != leftLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(left, i, leftLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(!unsafe && equalPrefixLength != rightLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(right, i, rightLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(unsafe) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            UChar32 c;
            do {
                U8_PREV_OR_FFFD(left, 0, equalPrefixLength, c);
            } while(equalPrefixLength > 0 && data->isUnsafeBackward(c, numeric));
        }
        // See the notes in the UTF-16 version.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength,
                                                     leftLength - equalPrefixLength,
                                                     right + equalPrefixLength,
                                                     rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength, -1,
                                                     right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            UTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            FCDUTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(leftLength > 0) {
        leftLength -= equalPrefixLength;
        rightLength -= equalPrefixLength;
    }
    if(settings->dontCheckFCD()) {
        UTF8NFDIterator leftIter(left, leftLength);
        UTF8NFDIterator rightIter(right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF8NFDIterator leftIter(data, left, leftLength);
        FCDUTF8NFDIterator rightIter(data, right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}